

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

void __thiscall CaDiCaL::Proof::flush_clause(Proof *this,Clause *c)

{
  char cVar1;
  uint uVar2;
  Internal *pIVar3;
  iterator __position;
  iterator iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  Clause *pCVar10;
  uint64_t id;
  int local_44;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_40;
  unsigned_long local_38;
  
  cVar9 = '\x01';
  if (this->internal->lrat == false) {
    cVar9 = this->internal->frat;
  }
  if (0 < c->size) {
    local_40 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->proof_chain;
    lVar8 = 0;
    do {
      uVar2 = *(uint *)((long)&c[1].field_0 + lVar8 * 4);
      pIVar3 = this->internal;
      uVar5 = uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = -uVar2;
      }
      cVar1 = pIVar3->vals[uVar5];
      iVar6 = 0;
      if (cVar1 != '\0') {
        if ((pIVar3->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5].level != 0) {
          cVar1 = '\0';
        }
        iVar6 = (int)cVar1;
      }
      iVar7 = -iVar6;
      if (-1 < (int)uVar2) {
        iVar7 = iVar6;
      }
      if (iVar7 < 0) {
        if (cVar9 != '\0') {
          local_38 = (pIVar3->unit_clauses_idx).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)(uVar5 << 1 | -uVar2 >> 0x1f)];
          iVar4._M_current =
               (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_40,iVar4,&local_38);
          }
          else {
            *iVar4._M_current = local_38;
            (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
        }
      }
      else {
        iVar6 = (pIVar3->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        local_44 = -iVar6;
        if (-1 < (int)uVar2) {
          local_44 = iVar6;
        }
        __position._M_current =
             (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->clause,__position,&local_44);
        }
        else {
          *__position._M_current = local_44;
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < c->size);
  }
  iVar4._M_current =
       (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->proof_chain,iVar4,
               (unsigned_long *)c);
  }
  else {
    *iVar4._M_current = (unsigned_long)c->field_0;
    (this->proof_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  this->redundant = (bool)((byte)(*(uint *)&c->field_0x8 >> 0xb) & 1);
  pCVar10 = (Clause *)(this->internal->clause_id + 1);
  this->internal->clause_id = (uint64_t)pCVar10;
  this->clause_id = (uint64_t)pCVar10;
  add_derived_clause(this);
  delete_clause(this,c);
  (c->field_0).copy = pCVar10;
  return;
}

Assistant:

void Proof::flush_clause (Clause *c) {
  LOG (c, "PROOF flushing falsified literals in");
  assert (clause.empty ());
  const bool antecedents = (internal->lrat || internal->frat);
  for (int i = 0; i < c->size; i++) {
    int internal_lit = c->literals[i];
    if (internal->fixed (internal_lit) < 0) {
      if (antecedents) {
        const unsigned uidx = internal->vlit (-internal_lit);
        uint64_t id = internal->unit_clauses (uidx);
        assert (id);
        proof_chain.push_back (id);
      }
      continue;
    }
    add_literal (internal_lit);
  }
  proof_chain.push_back (c->id);
  redundant = c->redundant;
  int64_t id = ++internal->clause_id;
  clause_id = id;
  add_derived_clause ();
  delete_clause (c);
  c->id = id;
}